

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O0

void rw::d3d9::uninstance(ObjPipeline *rwpipe,Atomic *atomic)

{
  Geometry *this;
  InstanceDataHeader *pIVar1;
  uint32 uVar2;
  uint16 *puVar3;
  uint local_50;
  uint local_4c;
  uint32 j;
  uint32 i;
  Mesh *mesh;
  InstanceData *inst;
  uint16 *indices;
  InstanceDataHeader *header;
  Geometry *geo;
  ObjPipeline *pipe;
  Atomic *atomic_local;
  ObjPipeline *rwpipe_local;
  
  this = atomic->geometry;
  if ((this->flags & 0x1000000) != 0) {
    uVar2 = MeshHeader::guessNumTriangles(this->meshHeader);
    this->numTriangles = uVar2;
    Geometry::allocateData(this);
    Geometry::allocateMeshes
              (this,(uint)this->meshHeader->numMeshes,this->meshHeader->totalIndices,0);
    pIVar1 = this->instData;
    puVar3 = d3d::lockIndices(*(void **)(pIVar1 + 4),0,0,0);
    mesh = *(Mesh **)(pIVar1 + 0x1a);
    _j = MeshHeader::getMeshes(this->meshHeader);
    for (local_4c = 0; local_4c < pIVar1[2].platform; local_4c = local_4c + 1) {
      if (*(int *)((long)&mesh->indices + 4) == 0) {
        memcpy(_j->indices,puVar3 + *(uint *)&mesh[1].material,
               (ulong)(uint)(*(int *)&mesh->indices << 1));
      }
      else {
        for (local_50 = 0; local_50 < *(uint *)&mesh->indices; local_50 = local_50 + 1) {
          _j->indices[local_50] =
               puVar3[*(int *)&mesh[1].material + local_50] +
               (short)*(undefined4 *)((long)&mesh->indices + 4);
        }
      }
      _j = _j + 1;
      mesh = mesh + 2;
    }
    d3d::unlockIndices(*(void **)(pIVar1 + 4));
    (**(code **)&rwpipe[1].super_Pipeline.platform)(this,pIVar1);
    Geometry::generateTriangles(this,(int8 *)0x0);
    this->flags = this->flags & 0xfeffffff;
    destroyNativeData(this,0,0);
  }
  return;
}

Assistant:

static void
uninstance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	if((geo->flags & Geometry::NATIVE) == 0)
		return;
	assert(geo->instData != nil);
	assert(geo->instData->platform == PLATFORM_D3D9);
	geo->numTriangles = geo->meshHeader->guessNumTriangles();
	geo->allocateData();
	geo->allocateMeshes(geo->meshHeader->numMeshes, geo->meshHeader->totalIndices, 0);

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	uint16 *indices = lockIndices(header->indexBuffer, 0, 0, 0);
	InstanceData *inst = header->inst;
	Mesh *mesh = geo->meshHeader->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		if(inst->minVert == 0)
			memcpy(mesh->indices, &indices[inst->startIndex], inst->numIndex*2);
		else
			for(uint32 j = 0; j < inst->numIndex; j++)
				mesh->indices[j] = indices[inst->startIndex+j] + inst->minVert;
		mesh++;
		inst++;
	}
	unlockIndices(header->indexBuffer);

	pipe->uninstanceCB(geo, header);
	geo->generateTriangles();
	geo->flags &= ~Geometry::NATIVE;
	destroyNativeData(geo, 0, 0);
}